

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrPubkey * __thiscall
cfd::core::SchnorrPubkey::operator+=
          (SchnorrPubkey *__return_storage_ptr__,SchnorrPubkey *this,ByteData256 *right)

{
  undefined1 local_38 [8];
  SchnorrPubkey key;
  ByteData256 *right_local;
  SchnorrPubkey *this_local;
  
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)right;
  CreateTweakAdd((SchnorrPubkey *)local_38,this,right,(bool *)0x0);
  operator=(this,(SchnorrPubkey *)local_38);
  SchnorrPubkey(__return_storage_ptr__,this);
  ~SchnorrPubkey((SchnorrPubkey *)local_38);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrPubkey::operator+=(const ByteData256 &right) {
  SchnorrPubkey key = CreateTweakAdd(right);
  *this = key;
  return *this;
}